

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int ecp_select_comb(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *T,uchar T_size,
                   uchar i)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar2 = 0;
  bVar3 = true;
  while( true ) {
    bVar4 = uVar2 == ((ulong)(T_size >> 1) & 0x3f);
    iVar1 = mbedtls_mpi_safe_cond_assign(&R->X,&T[uVar2].X,bVar4);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_safe_cond_assign(&R->Y,&T[uVar2].Y,bVar4);
    if (iVar1 != 0) break;
    uVar2 = 1;
    bVar4 = !bVar3;
    bVar3 = false;
    if (bVar4) {
      iVar1 = ecp_safe_invert_jac(grp,R,T_size >> 7);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_mpi_lset(&R->Z,1);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int ecp_select_comb(const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                           const mbedtls_ecp_point T[], unsigned char T_size,
                           unsigned char i)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char ii, j;

    /* Ignore the "sign" bit and scale down */
    ii =  (i & 0x7Fu) >> 1;

    /* Read the whole table to thwart cache-based timing attacks */
    for (j = 0; j < T_size; j++) {
        MPI_ECP_COND_ASSIGN(&R->X, &T[j].X, j == ii);
        MPI_ECP_COND_ASSIGN(&R->Y, &T[j].Y, j == ii);
    }

    /* Safely invert result if i is "negative" */
    MBEDTLS_MPI_CHK(ecp_safe_invert_jac(grp, R, i >> 7));

    MPI_ECP_LSET(&R->Z, 1);

cleanup:
    return ret;
}